

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O2

string * WeatherGetSource_abi_cxx11_(void)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char t [100];
  
  uVar2 = XDR_int::get(&wdr_weather_preset);
  uVar4 = 9;
  if (uVar2 < 9) {
    uVar4 = (ulong)uVar2;
  }
  uVar2 = XDR_int::get(&wdr_weather_source);
  uVar3 = 4;
  if (uVar2 < 4) {
    uVar3 = (ulong)uVar2;
  }
  if (bWeatherControlling == '\x01') {
    if ((uint)(dataRefs.weatherCtl + WC_METAR_XP) < 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)in_RDI,"LiveTraffic, unknown",(allocator<char> *)&local_a8);
      return in_RDI;
    }
    if (dataRefs.weatherCtl == WC_METAR_XP) {
      bVar1 = WeatherIsXPRealWeather();
      pcVar5 = "METAR up to";
      if (bVar1) {
        pcVar5 = "XP\'s real weather above";
      }
      snprintf(t,100,"LiveTraffic, using %s %dft AGL",pcVar5,
               (ulong)(uint)dataRefs.weatherMaxMETARheight_ft);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)in_RDI,t,(allocator<char> *)&local_a8);
      return in_RDI;
    }
    if (dataRefs.weatherCtl == WC_REAL_TRAFFIC) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)in_RDI,"LiveTraffic using RealTraffic weather data",
                 (allocator<char> *)&local_a8);
      return in_RDI;
    }
    pcVar5 = "?";
  }
  else {
    if (uVar2 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"X-Plane Preset",&local_a9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t,
                     &local_a8,", ");
      std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t,
                     WeatherGetSource::WEATHER_PRESETS._M_elems[uVar4]);
      std::__cxx11::string::~string((string *)t);
      std::__cxx11::string::~string((string *)&local_a8);
      if (setWeather.metar._M_string_length == 0) {
        return in_RDI;
      }
      std::__cxx11::string::append((char *)in_RDI);
      return in_RDI;
    }
    pcVar5 = WeatherGetSource::WEATHER_SOURCES._M_elems[uVar3];
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,pcVar5,(allocator<char> *)t);
  return in_RDI;
}

Assistant:

std::string WeatherGetSource ()
{
    // Preset closest to current conditions
    static std::array<const char*,10> WEATHER_PRESETS = {
        "Clear", "VFR Few", "VFR Scattered", "VFR Broken", "VFR Marginal", "IFR Non-precision", "IFR Precision", "Convective", "Large-cell Storms", "Unknown"
    };
    int preset = wdr_weather_preset.get();
    if (preset < 0 || preset > 8) preset = 9;           // 'Unknown'

    // Weather Source
    static std::array<const char*,5> WEATHER_SOURCES = {
        "X-Plane Preset", "X-Plane Real Weather", "Controlpad", "Plugin", "Unknown"
    };
    int source = wdr_weather_source.get();
    if (source < 0 || source > 3) source = 4;

    // Are we in control? Say so!
    if (WeatherInControl()) {
        char t[100];
        switch (dataRefs.GetWeatherControl()) {
            case WC_REAL_TRAFFIC:
                return "LiveTraffic using RealTraffic weather data";
            case WC_METAR_XP:
                snprintf(t, sizeof(t), "LiveTraffic, using %s %dft AGL",
                         (WeatherIsXPRealWeather() ? "XP's real weather above" : "METAR up to"),
                         dataRefs.GetWeatherMaxMetarHeight_ft());
                return std::string(t);
            case WC_NONE:
            case WC_INIT:
                return std::string("LiveTraffic, unknown");
        }
    }
    else if (source == 0) {                             // 'Preset'
        std::string s = std::string(WEATHER_SOURCES[size_t(source)]) + ", " + WEATHER_PRESETS[size_t(preset)];
        if (!setWeather.metar.empty()) {
            s += ", set from given METAR";
        }
        return s;
    }
    else
        return std::string(WEATHER_SOURCES[size_t(source)]);
    
    // Shouldn't be able to get here
    return "?";
}